

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iibmalloc.h
# Opt level: O0

void nodecpp::iibmalloc::IibAllocatorBase::bucketIdxest<150ul>(void)

{
  long lVar1;
  uchar local_4a;
  uchar local_49;
  unsigned_long local_48;
  anon_class_1_0_00000001 local_3a;
  byte local_39;
  long lStack_38;
  uint8_t addition;
  uint64_t ix;
  uchar local_21;
  undefined8 local_20;
  unsigned_long ix1;
  undefined8 uStack_10;
  uint8_t addition_1;
  unsigned_long ix_1;
  
  local_48 = 0x96;
  for (lVar1 = 0x3f; 0x95UL >> lVar1 == 0; lVar1 = lVar1 + -1) {
  }
  lVar1 = -(long)(int)((uint)lVar1 ^ 0x3f);
  local_39 = (byte)(0x95L >> ((char)lVar1 + 0x3eU & 0x3f)) & 1;
  lStack_38 = (lVar1 + 0x3d) * 2 + (ulong)local_39 + -1;
  local_49 = (uchar)lStack_38;
  ix = 0x95;
  uStack_10 = 7;
  ix1._7_1_ = 0;
  local_20 = 9;
  local_4a = '\t';
  local_21 = local_49;
  assert::
  nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,nodecpp::iibmalloc::IibAllocatorBase::bucketIdxest<150ul>()::_lambda()_1_,unsigned_long,unsigned_char,unsigned_char>
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
             ,0x51d,&local_3a,"sizeToIndexHalfExp( n ) == sizeToIndexHalfExpConstexpr< n >()",
             "for {}: {} vs {}",&local_48,&local_49,&local_4a);
  bucketIdxest<149ul>();
  return;
}

Assistant:

static void bucketIdxest()
	{
		if constexpr ( n >= 1 )
		{
#ifdef USE_EXP_BUCKET_SIZES
			NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, sizeToIndex( n ) == sizeToIndexConstexpr< n >(), "for {}: {} vs {}", n, sizeToIndex( n ), sizeToIndexConstexpr< n >() );
#elif defined USE_HALF_EXP_BUCKET_SIZES
			NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, sizeToIndexHalfExp( n ) == sizeToIndexHalfExpConstexpr< n >(), "for {}: {} vs {}", n, sizeToIndexHalfExp( n ), sizeToIndexHalfExpConstexpr< n >() );
#elif defined USE_QUAD_EXP_BUCKET_SIZES
			NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, sizeToIndexQuadExp( n ) == sizeToIndexQuadExpConstexpr< n >(), "for {}: {} vs {}", n, sizeToIndexQuadExp( n ), sizeToIndexQuadExpConstexpr< n >() );
#else
#error unexpected
#endif
			if constexpr ( n > 1 )
				bucketIdxest<n-1>();
		}
	}